

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::NextRequest>::construct(BasicTypeInfo<dap::NextRequest> *this,void *ptr)

{
  *(undefined8 *)((long)ptr + 0x20) = 0;
  *(undefined8 *)((long)ptr + 0x28) = 0;
  *(undefined8 *)((long)ptr + 0x10) = 0;
  *(undefined8 *)((long)ptr + 0x18) = 0;
  *(long *)ptr = (long)ptr + 0x10;
  *(undefined8 *)((long)ptr + 8) = 0;
  *(undefined1 *)((long)ptr + 0x20) = 0;
  *(undefined1 *)((long)ptr + 0x29) = 0;
  *(undefined8 *)((long)ptr + 0x30) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }